

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O0

QNode * despot::DESPOT::Prune(QNode *qnode,double *pruned_value)

{
  VNode *pVVar1;
  bool bVar2;
  int edge;
  QNode *this;
  pointer ppVar3;
  VNode *this_00;
  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *this_01;
  mapped_type *ppVVar4;
  double dVar5;
  ValuedAction VVar6;
  VNode *pruned_v;
  double nu;
  iterator iStack_48;
  ACT_TYPE astar;
  _Self local_40;
  iterator it;
  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *children;
  QNode *pruned_q;
  double *pruned_value_local;
  QNode *qnode_local;
  
  this = (QNode *)operator_new(0x88);
  edge = QNode::edge(qnode);
  QNode::QNode(this,(VNode *)0x0,edge);
  *pruned_value = qnode->step_reward - DAT_00278a80;
  it._M_node = (_Base_ptr)QNode::children(qnode);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
       ::begin((map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                *)it._M_node);
  while( true ) {
    iStack_48 = std::
                map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                ::end(it._M_node);
    bVar2 = std::operator!=(&local_40,&stack0xffffffffffffffb8);
    if (!bVar2) break;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_despot::VNode_*>_>::operator->
                       (&local_40);
    this_00 = Prune(ppVar3->second,(ACT_TYPE *)((long)&nu + 4),(double *)&pruned_v);
    pVVar1 = pruned_v;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_despot::VNode_*>_>::operator->
                       (&local_40);
    VVar6 = VNode::default_move(ppVar3->second);
    if (((double)pVVar1 != VVar6.value) || (NAN((double)pVVar1) || NAN(VVar6.value))) {
      this_01 = QNode::children(this);
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_despot::VNode_*>_>::operator->
                         (&local_40);
      ppVVar4 = std::
                map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                ::operator[](this_01,&ppVar3->first);
      *ppVVar4 = this_00;
      VNode::parent(this_00,this);
    }
    else if (this_00 != (VNode *)0x0) {
      VNode::~VNode(this_00);
      operator_delete(this_00,0x98);
    }
    *pruned_value = (double)pruned_v + *pruned_value;
    std::_Rb_tree_iterator<std::pair<const_unsigned_long,_despot::VNode_*>_>::operator++
              (&local_40,0);
  }
  dVar5 = QNode::lower_bound(qnode);
  QNode::lower_bound(this,dVar5);
  dVar5 = QNode::upper_bound(qnode);
  QNode::upper_bound(this,dVar5);
  return this;
}

Assistant:

QNode* DESPOT::Prune(QNode* qnode, double& pruned_value) {
	QNode* pruned_q = new QNode((VNode*) NULL, qnode->edge());
	pruned_value = qnode->step_reward - Globals::config.pruning_constant;
	map<OBS_TYPE, VNode*>& children = qnode->children();
	for (map<OBS_TYPE, VNode*>::iterator it = children.begin();
		it != children.end(); it++) {
		ACT_TYPE astar;
		double nu;
		VNode* pruned_v = Prune(it->second, astar, nu);
		if (nu == it->second->default_move().value) {
			delete pruned_v;
		} else {
			pruned_q->children()[it->first] = pruned_v;
			pruned_v->parent(pruned_q);
		}
		pruned_value += nu;
	}

	pruned_q->lower_bound(qnode->lower_bound()); // for debugging
	pruned_q->upper_bound(qnode->upper_bound()); // for debugging

	return pruned_q;
}